

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_2U>::getUINT
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_2U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t outValue_1;
  uint8_t outValue;
  uint uVar8;
  allocator_type local_31;
  
  if (2 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x3d7,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getUINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
                 );
  }
  uVar4 = targetBits - 8 >> 3;
  uVar8 = targetBits << 0x1d | uVar4;
  if ((uVar8 < 8) && ((0x8bU >> (uVar4 & 0x1f) & 1) != 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,
               (ulong)((targetBits >> 3) * numChannels * (this->super_Image).height *
                      (this->super_Image).width),&local_31);
    uVar4 = (this->super_Image).height;
    if (uVar4 != 0) {
      uVar5 = (this->super_Image).width;
      uVar3 = 0;
      uVar7 = uVar5;
      do {
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          uVar4 = 0;
          do {
            if (numChannels != 0) {
              uVar5 = 0;
              do {
                uVar6 = (this->super_Image).width * uVar3 + uVar4;
                if (uVar8 < 8) {
                  bVar1 = *(byte *)((long)this->pixels +
                                   (((ulong)uVar6 * 2 + 1) - (ulong)(uVar5 == 0)));
                  puVar2 = (__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar6 = (uVar6 * numChannels + uVar5) * (targetBits >> 3);
                  switch(uVar8) {
                  case 0:
                    puVar2[uVar6] = bVar1;
                    break;
                  case 1:
                    *(ushort *)(puVar2 + uVar6) = (ushort)bVar1;
                    break;
                  case 3:
                    *(uint *)(puVar2 + uVar6) = (uint)bVar1;
                    break;
                  case 7:
                    *(ulong *)(puVar2 + uVar6) = (ulong)bVar1;
                  }
                }
                uVar5 = uVar5 + 1;
              } while (numChannels != uVar5);
              uVar5 = (this->super_Image).width;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar5);
          uVar4 = (this->super_Image).height;
          uVar7 = uVar5;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar4);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x3d8,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getUINT(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUINT(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32 || targetBits == 64);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : c != 3 ? 0 : componentType{1};
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 8) {
                        const auto outValue = static_cast<uint64_t>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }